

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.c
# Opt level: O0

void update_joybutton(uint8_t button,_Bool state)

{
  byte bVar1;
  KEYINPUT_t *pKVar2;
  byte in_SIL;
  undefined1 in_DIL;
  KEYINPUT_t *KEYINPUT;
  
  bVar1 = in_SIL & 1;
  pKVar2 = get_keyinput();
  switch(in_DIL) {
  case 0:
    pKVar2->raw = pKVar2->raw & 0xfffe | (ushort)((bVar1 ^ 0xff) & 1);
    break;
  case 1:
    pKVar2->raw = pKVar2->raw & 0xfffd | (ushort)((bVar1 ^ 0xff) & 1) << 1;
    break;
  default:
    break;
  case 4:
  case 5:
    pKVar2->raw = pKVar2->raw & 0xfffb | (ushort)((bVar1 ^ 0xff) & 1) << 2;
    break;
  case 6:
    pKVar2->raw = pKVar2->raw & 0xfff7 | (ushort)((bVar1 ^ 0xff) & 1) << 3;
    break;
  case 9:
    pKVar2->raw = pKVar2->raw & 0xfdff | (ushort)((bVar1 ^ 0xff) & 1) << 9;
    break;
  case 10:
    pKVar2->raw = pKVar2->raw & 0xfeff | (ushort)((bVar1 ^ 0xff) & 1) << 8;
    break;
  case 0xb:
    pKVar2->raw = pKVar2->raw & 0xffbf | (ushort)((bVar1 ^ 0xff) & 1) << 6;
    break;
  case 0xc:
    pKVar2->raw = pKVar2->raw & 0xff7f | (ushort)((bVar1 ^ 0xff) & 1) << 7;
    break;
  case 0xd:
    pKVar2->raw = pKVar2->raw & 0xffdf | (ushort)((bVar1 ^ 0xff) & 1) << 5;
    break;
  case 0xe:
    pKVar2->raw = pKVar2->raw & 0xffef | (ushort)((bVar1 ^ 0xff) & 1) << 4;
  }
  return;
}

Assistant:

void update_joybutton(byte button, bool state) {
    KEYINPUT_t* KEYINPUT = get_keyinput();
    switch (button) {
        case SDL_CONTROLLER_BUTTON_DPAD_UP:
            KEYINPUT->up = !state;
            break;
        case SDL_CONTROLLER_BUTTON_DPAD_DOWN:
            KEYINPUT->down = !state;
            break;
        case SDL_CONTROLLER_BUTTON_DPAD_LEFT:
            KEYINPUT->left = !state;
            break;
        case SDL_CONTROLLER_BUTTON_DPAD_RIGHT:
            KEYINPUT->right = !state;
            break;
        case SDL_CONTROLLER_BUTTON_A:
            KEYINPUT->a = !state;
            break;
        case SDL_CONTROLLER_BUTTON_B:
            KEYINPUT->b = !state;
            break;
        case SDL_CONTROLLER_BUTTON_START:
            KEYINPUT->start = !state;
            break;
        case SDL_CONTROLLER_BUTTON_GUIDE:
        case SDL_CONTROLLER_BUTTON_BACK:
            KEYINPUT->select = !state;
            break;
        case SDL_CONTROLLER_BUTTON_LEFTSHOULDER:
            KEYINPUT->l = !state;
            break;
        case SDL_CONTROLLER_BUTTON_RIGHTSHOULDER:
            KEYINPUT->r = !state;
            break;
        default:
            break;
    }
}